

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qstringlist.cpp
# Opt level: O1

qsizetype QtPrivate::QStringList_indexOf(QStringList *that,QRegularExpression *re,qsizetype from)

{
  QStringView expression;
  bool bVar1;
  PatternOptions options;
  storage_type_conflict *unaff_RBX;
  ulong uVar2;
  long lVar3;
  long in_FS_OFFSET;
  QRegularExpressionMatch m;
  QRegularExpression exactRe;
  QRegularExpressionMatch local_78;
  QString local_70;
  QString local_58;
  qsizetype qVar4;
  
  qVar4 = *(qsizetype *)(in_FS_OFFSET + 0x28);
  if (from < 0) {
    from = from + (that->d).size;
    if (from < 1) {
      from = 0;
    }
  }
  local_58.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QRegularExpression::pattern(&local_70,re);
  expression.m_data = unaff_RBX;
  expression.m_size = qVar4;
  QRegularExpression::anchoredPattern(expression);
  if (&(local_70.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_70.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_70.d.d)->super_QArrayData,2,0x10);
    }
  }
  local_70.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  options = QRegularExpression::patternOptions(re);
  QRegularExpression::QRegularExpression((QRegularExpression *)&local_70,&local_58,options);
  uVar2 = 0xffffffffffffffff;
  if ((ulong)from < (ulong)(that->d).size) {
    lVar3 = from * 0x18;
    do {
      local_78.d.d.ptr =
           (QExplicitlySharedDataPointer<QRegularExpressionMatchPrivate>)&DAT_aaaaaaaaaaaaaaaa;
      QRegularExpression::match
                ((QRegularExpression *)&local_78,&local_70,(long)&(((that->d).ptr)->d).d + lVar3,
                 NormalMatch,(MatchOptions)0x0);
      bVar1 = QRegularExpressionMatch::hasMatch(&local_78);
      QRegularExpressionMatch::~QRegularExpressionMatch(&local_78);
      uVar2 = from;
      if (bVar1) goto LAB_00342eb5;
      from = from + 1;
      lVar3 = lVar3 + 0x18;
    } while ((ulong)from < (ulong)(that->d).size);
    uVar2 = 0xffffffffffffffff;
  }
LAB_00342eb5:
  QRegularExpression::~QRegularExpression((QRegularExpression *)&local_70);
  if (&(local_58.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_58.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_58.d.d)->super_QArrayData,2,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == qVar4) {
    return uVar2;
  }
  __stack_chk_fail();
}

Assistant:

qsizetype QtPrivate::QStringList_indexOf(const QStringList *that, const QRegularExpression &re, qsizetype from)
{
    if (from < 0)
        from = qMax(from + that->size(), qsizetype(0));

    QString exactPattern = QRegularExpression::anchoredPattern(re.pattern());
    QRegularExpression exactRe(exactPattern, re.patternOptions());

    for (qsizetype i = from; i < that->size(); ++i) {
        QRegularExpressionMatch m = exactRe.match(that->at(i));
        if (m.hasMatch())
            return i;
    }
    return -1;
}